

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  char *pcVar1;
  string *psVar2;
  ostream *poVar3;
  string filename;
  cmGeneratedFileStream fout;
  long *local_278 [2];
  long local_268 [2];
  undefined1 local_258 [584];
  
  pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_278,pcVar1,(allocator *)local_258);
  std::__cxx11::string::append((char *)local_278);
  std::__cxx11::string::_M_append((char *)local_278,(ulong)(this->ProjectName)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)local_278);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_258,(char *)local_278[0],false,None);
  if (((byte)(*(_func_int **)(local_258._0_8_ + -0x18))[(long)(local_258 + 0x20)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"#Generated by ",0xe);
    psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_258,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", do not edit.\n",0xf);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/";
  filename += this->ProjectName;
  filename += ".kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}